

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<int,long>(char *types)

{
  bool bVar1;
  char *pcVar2;
  string msg_2;
  int x;
  string msg_1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  int ret;
  TestCase<int,_long,_4> test;
  TestVector<int,_long,_4> tests;
  long in_stack_fffffffffffffda8;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffdb0;
  allocator *in_stack_fffffffffffffdb8;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdc0;
  undefined8 local_200;
  byte local_1f0;
  allocator local_1e1;
  string local_1e0 [15];
  undefined1 in_stack_fffffffffffffe2f;
  long in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  string *in_stack_fffffffffffffe40;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_158;
  int local_150;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_c0;
  byte local_ba;
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  string local_60 [40];
  undefined8 local_38;
  long local_30;
  byte local_28;
  TestVector<int,_long,_4> local_20;
  
  TestVector<int,_long,_4>::TestVector(&local_20);
  TestVector<int,_long,_4>::GetNext((TestVector<int,_long,_4> *)in_stack_fffffffffffffdc0.m_int);
  while( true ) {
    bVar1 = TestVector<int,_long,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<int,long>
                      ((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),in_stack_fffffffffffffda8,
                       (int *)0x1ba815);
    if (bVar1 != (bool)(local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Error in case ",&local_81);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,pcVar2,&local_b9);
      err_msg<int,long>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                        in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::~string(local_60);
    }
    local_ba = 1;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_c0,(int *)&local_38);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if ((local_ba & 1) != (local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"Error in case ",&local_121);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,pcVar2,&local_149);
      err_msg<int,long>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                        in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::~string(local_e0);
    }
    local_ba = 1;
    local_150 = (int)local_38;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_158,&local_30);
    operator-=((int *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    if ((local_ba & 1) != (local_28 & 1)) {
      in_stack_fffffffffffffdc0.m_int = (long)&stack0xfffffffffffffe47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b8,"Error in case ",(allocator *)in_stack_fffffffffffffdc0.m_int);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
      in_stack_fffffffffffffdb0 =
           (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
           std::__cxx11::string::c_str();
      in_stack_fffffffffffffdb8 = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e0,(char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
      err_msg<int,long>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                        in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      std::__cxx11::string::~string(local_178);
    }
    TestVector<int,_long,_4>::GetNext((TestVector<int,_long,_4> *)in_stack_fffffffffffffdc0.m_int);
    local_38 = local_200;
    local_28 = local_1f0;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}